

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubcommandTest.cpp
# Opt level: O2

void __thiscall TApp_SubcomInheritCaseCheck_Test::TestBody(TApp_SubcomInheritCaseCheck_Test *this)

{
  App *this_00;
  input_t *piVar1;
  App *pAVar2;
  reference ppAVar3;
  char *pcVar4;
  AssertHelper local_f8;
  AssertionResult gtest_ar;
  _Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_> local_e0;
  unsigned_long local_c0;
  App *sub2;
  App *sub1;
  string local_a8;
  string local_88;
  string local_68;
  string local_48;
  
  this_00 = &(this->super_TApp).app;
  CLI::App::ignore_case(this_00,true);
  std::__cxx11::string::string((string *)&local_48,"sub1",(allocator *)&local_e0);
  std::__cxx11::string::string((string *)&local_68,"",(allocator *)&gtest_ar);
  pAVar2 = CLI::App::add_subcommand(this_00,&local_48,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_48);
  sub1 = pAVar2;
  std::__cxx11::string::string((string *)&local_88,"sub2",(allocator *)&local_e0);
  pcVar4 = "";
  std::__cxx11::string::string((string *)&local_a8,"",(allocator *)&gtest_ar);
  pAVar2 = CLI::App::add_subcommand(this_00,&local_88,&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_88);
  sub2 = pAVar2;
  TApp::run(&this->super_TApp);
  local_f8.data_ = (AssertHelperData *)0x0;
  CLI::App::get_subcommands
            ((vector<CLI::App_*,_std::allocator<CLI::App_*>_> *)&local_e0,this_00,true);
  local_c0 = (long)local_e0._M_impl.super__Vector_impl_data._M_finish -
             (long)local_e0._M_impl.super__Vector_impl_data._M_start >> 3;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&gtest_ar,"(size_t)0","app.get_subcommands().size()",
             (unsigned_long *)&local_f8,&local_c0);
  CLI::std::_Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>::~_Vector_base(&local_e0);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_e0);
    if (gtest_ar.message_.ptr_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/SubcommandTest.cpp"
               ,0x1ff,pcVar4);
    testing::internal::AssertHelper::operator=(&local_f8,(Message *)&local_e0);
    testing::internal::AssertHelper::~AssertHelper(&local_f8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_e0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  CLI::App::reset(this_00);
  std::__cxx11::string::string((string *)&local_e0,"SuB1",(allocator *)&gtest_ar);
  piVar1 = &(this->super_TApp).args;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_assign_aux<std::__cxx11::string_const*>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)piVar1,&local_e0,
             &local_c0);
  std::__cxx11::string::~string((string *)&local_e0);
  TApp::run(&this->super_TApp);
  CLI::App::get_subcommands
            ((vector<CLI::App_*,_std::allocator<CLI::App_*>_> *)&local_e0,this_00,true);
  ppAVar3 = CLI::std::vector<CLI::App_*,_std::allocator<CLI::App_*>_>::at
                      ((vector<CLI::App_*,_std::allocator<CLI::App_*>_> *)&local_e0,0);
  testing::internal::CmpHelperEQ<CLI::App*,CLI::App*>
            ((internal *)&gtest_ar,"sub1","app.get_subcommands().at(0)",&sub1,ppAVar3);
  CLI::std::_Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>::~_Vector_base(&local_e0);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_e0);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/SubcommandTest.cpp"
               ,0x204,pcVar4);
    testing::internal::AssertHelper::operator=(&local_f8,(Message *)&local_e0);
    testing::internal::AssertHelper::~AssertHelper(&local_f8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_e0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  CLI::App::reset(this_00);
  local_f8.data_ = (AssertHelperData *)0x0;
  CLI::App::get_subcommands
            ((vector<CLI::App_*,_std::allocator<CLI::App_*>_> *)&local_e0,this_00,true);
  local_c0 = (long)local_e0._M_impl.super__Vector_impl_data._M_finish -
             (long)local_e0._M_impl.super__Vector_impl_data._M_start >> 3;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&gtest_ar,"(size_t)0","app.get_subcommands().size()",
             (unsigned_long *)&local_f8,&local_c0);
  CLI::std::_Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>::~_Vector_base(&local_e0);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_e0);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/SubcommandTest.cpp"
               ,0x207,pcVar4);
    testing::internal::AssertHelper::operator=(&local_f8,(Message *)&local_e0);
    testing::internal::AssertHelper::~AssertHelper(&local_f8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_e0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  std::__cxx11::string::string((string *)&local_e0,"sUb2",(allocator *)&gtest_ar);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_assign_aux<std::__cxx11::string_const*>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)piVar1,&local_e0,
             &local_c0);
  std::__cxx11::string::~string((string *)&local_e0);
  TApp::run(&this->super_TApp);
  CLI::App::get_subcommands
            ((vector<CLI::App_*,_std::allocator<CLI::App_*>_> *)&local_e0,this_00,true);
  ppAVar3 = CLI::std::vector<CLI::App_*,_std::allocator<CLI::App_*>_>::at
                      ((vector<CLI::App_*,_std::allocator<CLI::App_*>_> *)&local_e0,0);
  testing::internal::CmpHelperEQ<CLI::App*,CLI::App*>
            ((internal *)&gtest_ar,"sub2","app.get_subcommands().at(0)",&sub2,ppAVar3);
  CLI::std::_Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>::~_Vector_base(&local_e0);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_e0);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/SubcommandTest.cpp"
               ,0x20b,pcVar4);
    testing::internal::AssertHelper::operator=(&local_f8,(Message *)&local_e0);
    testing::internal::AssertHelper::~AssertHelper(&local_f8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_e0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TEST_F(TApp, SubcomInheritCaseCheck) {
    app.ignore_case();
    auto sub1 = app.add_subcommand("sub1");
    auto sub2 = app.add_subcommand("sub2");

    run();
    EXPECT_EQ((size_t)0, app.get_subcommands().size());

    app.reset();
    args = {"SuB1"};
    run();
    EXPECT_EQ(sub1, app.get_subcommands().at(0));

    app.reset();
    EXPECT_EQ((size_t)0, app.get_subcommands().size());

    args = {"sUb2"};
    run();
    EXPECT_EQ(sub2, app.get_subcommands().at(0));
}